

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QPainterClipInfo>::moveAppend
          (QGenericArrayOps<QPainterClipInfo> *this,QPainterClipInfo *b,QPainterClipInfo *e)

{
  QPainterClipInfo *pQVar1;
  QRegionData *pQVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  qreal qVar6;
  undefined4 uVar7;
  Representation RVar8;
  Representation RVar9;
  Representation RVar10;
  long lVar11;
  long lVar12;
  QPainterClipInfo *pQVar13;
  QPainterClipInfo *pQVar14;
  byte bVar15;
  
  bVar15 = 0;
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QPainterClipInfo>).ptr;
    lVar11 = (this->super_QArrayDataPointer<QPainterClipInfo>).size;
    do {
      pQVar1[lVar11].operation = b->operation;
      pQVar13 = b;
      pQVar14 = pQVar1 + lVar11;
      for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
        uVar7 = *(undefined4 *)&pQVar13->field_0x4;
        pQVar14->clipType = pQVar13->clipType;
        *(undefined4 *)&pQVar14->field_0x4 = uVar7;
        pQVar13 = (QPainterClipInfo *)((long)pQVar13 + (ulong)bVar15 * -0x10 + 8);
        pQVar14 = (QPainterClipInfo *)((long)pQVar14 + (ulong)bVar15 * -0x10 + 8);
      }
      QPainterPath::QPainterPath(&pQVar1[lVar11].path,&b->path);
      pQVar2 = (b->region).d;
      (b->region).d = &QRegion::shared_empty;
      pQVar1[lVar11].region.d = pQVar2;
      RVar8.m_i = (b->rect).y1.m_i;
      RVar9.m_i = (b->rect).x2.m_i;
      RVar10.m_i = (b->rect).y2.m_i;
      qVar3 = (b->rectf).xp;
      qVar4 = (b->rectf).yp;
      qVar5 = (b->rectf).w;
      qVar6 = (b->rectf).h;
      pQVar1[lVar11].rect.x1 = (Representation)(b->rect).x1.m_i;
      pQVar1[lVar11].rect.y1 = (Representation)RVar8.m_i;
      pQVar1[lVar11].rect.x2 = (Representation)RVar9.m_i;
      pQVar1[lVar11].rect.y2 = (Representation)RVar10.m_i;
      pQVar1[lVar11].rectf.xp = qVar3;
      pQVar1[lVar11].rectf.yp = qVar4;
      pQVar1[lVar11].rectf.w = qVar5;
      pQVar1[lVar11].rectf.h = qVar6;
      lVar11 = (this->super_QArrayDataPointer<QPainterClipInfo>).size + 1;
      (this->super_QArrayDataPointer<QPainterClipInfo>).size = lVar11;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }